

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O0

void radf3_ps(int ido,int l1,v4sf *cc,v4sf *ch,float *wa1,float *wa2)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  v4sf *pafVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  v4sf tmp_1;
  v4sf tmp;
  v4sf wi2;
  v4sf wr2;
  v4sf wi1;
  v4sf wr1;
  v4sf tr3;
  v4sf tr2;
  v4sf ti3;
  v4sf ti2;
  v4sf dr3;
  v4sf dr2;
  v4sf cr2;
  v4sf di3;
  v4sf di2;
  v4sf ci2;
  int local_5b8;
  int ic;
  int k;
  int i;
  float *wa2_local;
  float *wa1_local;
  v4sf *ch_local;
  v4sf *cc_local;
  int l1_local;
  int ido_local;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  for (local_5b8 = 0; local_5b8 < l1; local_5b8 = local_5b8 + 1) {
    uVar1 = *(undefined8 *)cc[(local_5b8 + l1) * ido];
    uVar2 = *(undefined8 *)(cc[(local_5b8 + l1) * ido] + 2);
    uVar3 = *(undefined8 *)cc[(local_5b8 + l1 * 2) * ido];
    uVar4 = *(undefined8 *)(cc[(local_5b8 + l1 * 2) * ido] + 2);
    local_3f8 = (float)uVar1;
    fStack_3f4 = (float)((ulong)uVar1 >> 0x20);
    fStack_3f0 = (float)uVar2;
    fStack_3ec = (float)((ulong)uVar2 >> 0x20);
    local_408 = (float)uVar3;
    fStack_404 = (float)((ulong)uVar3 >> 0x20);
    fStack_400 = (float)uVar4;
    fStack_3fc = (float)((ulong)uVar4 >> 0x20);
    uVar1 = *(undefined8 *)cc[local_5b8 * ido];
    uVar2 = *(undefined8 *)(cc[local_5b8 * ido] + 2);
    local_418 = (float)uVar1;
    fStack_414 = (float)((ulong)uVar1 >> 0x20);
    fStack_410 = (float)uVar2;
    fStack_40c = (float)((ulong)uVar2 >> 0x20);
    pafVar5 = ch + local_5b8 * ido * 3;
    (*pafVar5)[0] = local_418 + local_3f8 + local_408;
    (*pafVar5)[1] = fStack_414 + fStack_3f4 + fStack_404;
    (*pafVar5)[2] = fStack_410 + fStack_3f0 + fStack_400;
    (*pafVar5)[3] = fStack_40c + fStack_3ec + fStack_3fc;
    uVar1 = *(undefined8 *)cc[(local_5b8 + l1 * 2) * ido];
    uVar2 = *(undefined8 *)(cc[(local_5b8 + l1 * 2) * ido] + 2);
    uVar3 = *(undefined8 *)cc[(local_5b8 + l1) * ido];
    uVar4 = *(undefined8 *)(cc[(local_5b8 + l1) * ido] + 2);
    local_18 = (float)uVar1;
    fStack_14 = (float)((ulong)uVar1 >> 0x20);
    fStack_10 = (float)uVar2;
    fStack_c = (float)((ulong)uVar2 >> 0x20);
    local_28 = (float)uVar3;
    fStack_24 = (float)((ulong)uVar3 >> 0x20);
    fStack_20 = (float)uVar4;
    fStack_1c = (float)((ulong)uVar4 >> 0x20);
    pafVar5 = ch + (local_5b8 * 3 + 2) * ido;
    (*pafVar5)[0] = (local_18 - local_28) * 0.8660254;
    (*pafVar5)[1] = (fStack_14 - fStack_24) * 0.8660254;
    (*pafVar5)[2] = (fStack_10 - fStack_20) * 0.8660254;
    (*pafVar5)[3] = (fStack_c - fStack_1c) * 0.8660254;
    uVar1 = *(undefined8 *)cc[local_5b8 * ido];
    uVar2 = *(undefined8 *)(cc[local_5b8 * ido] + 2);
    local_438 = (float)uVar1;
    fStack_434 = (float)((ulong)uVar1 >> 0x20);
    fStack_430 = (float)uVar2;
    fStack_42c = (float)((ulong)uVar2 >> 0x20);
    pafVar5 = ch + (ido + -1 + (local_5b8 * 3 + 1) * ido);
    (*pafVar5)[0] = local_438 + (local_3f8 + local_408) * -0.5;
    (*pafVar5)[1] = fStack_434 + (fStack_3f4 + fStack_404) * -0.5;
    (*pafVar5)[2] = fStack_430 + (fStack_3f0 + fStack_400) * -0.5;
    (*pafVar5)[3] = fStack_42c + (fStack_3ec + fStack_3fc) * -0.5;
  }
  if (ido != 1) {
    for (local_5b8 = 0; local_5b8 < l1; local_5b8 = local_5b8 + 1) {
      for (ic = 2; ic < ido; ic = ic + 2) {
        fVar10 = wa1[ic + -2];
        fVar11 = wa1[ic + -1];
        uVar1 = *(undefined8 *)cc[ic + -1 + (local_5b8 + l1) * ido];
        uVar2 = *(undefined8 *)(cc[ic + -1 + (local_5b8 + l1) * ido] + 2);
        uVar3 = *(undefined8 *)cc[ic + (local_5b8 + l1) * ido];
        uVar4 = *(undefined8 *)(cc[ic + (local_5b8 + l1) * ido] + 2);
        local_278 = (float)uVar1;
        fStack_274 = (float)((ulong)uVar1 >> 0x20);
        fStack_270 = (float)uVar2;
        fStack_26c = (float)((ulong)uVar2 >> 0x20);
        local_2b8 = (float)uVar3;
        fStack_2b4 = (float)((ulong)uVar3 >> 0x20);
        fStack_2b0 = (float)uVar4;
        fStack_2ac = (float)((ulong)uVar4 >> 0x20);
        fVar6 = local_278 * fVar10 + local_2b8 * fVar11;
        fVar12 = fStack_274 * fVar10 + fStack_2b4 * fVar11;
        fVar18 = fStack_270 * fVar10 + fStack_2b0 * fVar11;
        fVar24 = fStack_26c * fVar10 + fStack_2ac * fVar11;
        fVar7 = local_2b8 * fVar10 - local_278 * fVar11;
        fVar13 = fStack_2b4 * fVar10 - fStack_274 * fVar11;
        fVar19 = fStack_2b0 * fVar10 - fStack_270 * fVar11;
        fVar25 = fStack_2ac * fVar10 - fStack_26c * fVar11;
        fVar10 = wa2[ic + -2];
        fVar11 = wa2[ic + -1];
        uVar1 = *(undefined8 *)cc[ic + -1 + (local_5b8 + l1 * 2) * ido];
        uVar2 = *(undefined8 *)(cc[ic + -1 + (local_5b8 + l1 * 2) * ido] + 2);
        uVar3 = *(undefined8 *)cc[ic + (local_5b8 + l1 * 2) * ido];
        uVar4 = *(undefined8 *)(cc[ic + (local_5b8 + l1 * 2) * ido] + 2);
        local_2f8 = (float)uVar1;
        fStack_2f4 = (float)((ulong)uVar1 >> 0x20);
        fStack_2f0 = (float)uVar2;
        fStack_2ec = (float)((ulong)uVar2 >> 0x20);
        local_338 = (float)uVar3;
        fStack_334 = (float)((ulong)uVar3 >> 0x20);
        fStack_330 = (float)uVar4;
        fStack_32c = (float)((ulong)uVar4 >> 0x20);
        fVar8 = local_2f8 * fVar10 + local_338 * fVar11;
        fVar14 = fStack_2f4 * fVar10 + fStack_334 * fVar11;
        fVar20 = fStack_2f0 * fVar10 + fStack_330 * fVar11;
        fVar26 = fStack_2ec * fVar10 + fStack_32c * fVar11;
        fVar9 = local_338 * fVar10 - local_2f8 * fVar11;
        fVar15 = fStack_334 * fVar10 - fStack_2f4 * fVar11;
        fVar21 = fStack_330 * fVar10 - fStack_2f0 * fVar11;
        fVar27 = fStack_32c * fVar10 - fStack_2ec * fVar11;
        fVar10 = fVar6 + fVar8;
        fVar16 = fVar12 + fVar14;
        fVar22 = fVar18 + fVar20;
        fVar28 = fVar24 + fVar26;
        fVar11 = fVar7 + fVar9;
        fVar17 = fVar13 + fVar15;
        fVar23 = fVar19 + fVar21;
        fVar29 = fVar25 + fVar27;
        uVar1 = *(undefined8 *)cc[ic + -1 + local_5b8 * ido];
        uVar2 = *(undefined8 *)(cc[ic + -1 + local_5b8 * ido] + 2);
        local_4d8 = (float)uVar1;
        fStack_4d4 = (float)((ulong)uVar1 >> 0x20);
        fStack_4d0 = (float)uVar2;
        fStack_4cc = (float)((ulong)uVar2 >> 0x20);
        pafVar5 = ch + (ic + -1 + local_5b8 * ido * 3);
        (*pafVar5)[0] = local_4d8 + fVar10;
        (*pafVar5)[1] = fStack_4d4 + fVar16;
        (*pafVar5)[2] = fStack_4d0 + fVar22;
        (*pafVar5)[3] = fStack_4cc + fVar28;
        uVar1 = *(undefined8 *)cc[ic + local_5b8 * ido];
        uVar2 = *(undefined8 *)(cc[ic + local_5b8 * ido] + 2);
        local_4f8 = (float)uVar1;
        fStack_4f4 = (float)((ulong)uVar1 >> 0x20);
        fStack_4f0 = (float)uVar2;
        fStack_4ec = (float)((ulong)uVar2 >> 0x20);
        pafVar5 = ch + (ic + local_5b8 * ido * 3);
        (*pafVar5)[0] = local_4f8 + fVar11;
        (*pafVar5)[1] = fStack_4f4 + fVar17;
        (*pafVar5)[2] = fStack_4f0 + fVar23;
        (*pafVar5)[3] = fStack_4ec + fVar29;
        uVar1 = *(undefined8 *)cc[ic + -1 + local_5b8 * ido];
        uVar2 = *(undefined8 *)(cc[ic + -1 + local_5b8 * ido] + 2);
        local_518 = (float)uVar1;
        fStack_514 = (float)((ulong)uVar1 >> 0x20);
        fStack_510 = (float)uVar2;
        fStack_50c = (float)((ulong)uVar2 >> 0x20);
        local_518 = local_518 + fVar10 * -0.5;
        fStack_514 = fStack_514 + fVar16 * -0.5;
        fStack_510 = fStack_510 + fVar22 * -0.5;
        fStack_50c = fStack_50c + fVar28 * -0.5;
        uVar1 = *(undefined8 *)cc[ic + local_5b8 * ido];
        uVar2 = *(undefined8 *)(cc[ic + local_5b8 * ido] + 2);
        local_538 = (float)uVar1;
        fStack_534 = (float)((ulong)uVar1 >> 0x20);
        fStack_530 = (float)uVar2;
        fStack_52c = (float)((ulong)uVar2 >> 0x20);
        local_538 = local_538 + fVar11 * -0.5;
        fStack_534 = fStack_534 + fVar17 * -0.5;
        fStack_530 = fStack_530 + fVar23 * -0.5;
        fStack_52c = fStack_52c + fVar29 * -0.5;
        fVar10 = (fVar7 - fVar9) * 0.8660254;
        fVar7 = (fVar13 - fVar15) * 0.8660254;
        fVar9 = (fVar19 - fVar21) * 0.8660254;
        fVar13 = (fVar25 - fVar27) * 0.8660254;
        fVar11 = (fVar8 - fVar6) * 0.8660254;
        fVar6 = (fVar14 - fVar12) * 0.8660254;
        fVar8 = (fVar20 - fVar18) * 0.8660254;
        fVar12 = (fVar26 - fVar24) * 0.8660254;
        pafVar5 = ch + (ic + -1 + (local_5b8 * 3 + 2) * ido);
        (*pafVar5)[0] = local_518 + fVar10;
        (*pafVar5)[1] = fStack_514 + fVar7;
        (*pafVar5)[2] = fStack_510 + fVar9;
        (*pafVar5)[3] = fStack_50c + fVar13;
        pafVar5 = ch + ((ido - ic) + -1 + (local_5b8 * 3 + 1) * ido);
        (*pafVar5)[0] = local_518 - fVar10;
        (*pafVar5)[1] = fStack_514 - fVar7;
        (*pafVar5)[2] = fStack_510 - fVar9;
        (*pafVar5)[3] = fStack_50c - fVar13;
        pafVar5 = ch + (ic + (local_5b8 * 3 + 2) * ido);
        (*pafVar5)[0] = local_538 + fVar11;
        (*pafVar5)[1] = fStack_534 + fVar6;
        (*pafVar5)[2] = fStack_530 + fVar8;
        (*pafVar5)[3] = fStack_52c + fVar12;
        pafVar5 = ch + ((ido - ic) + (local_5b8 * 3 + 1) * ido);
        (*pafVar5)[0] = fVar11 - local_538;
        (*pafVar5)[1] = fVar6 - fStack_534;
        (*pafVar5)[2] = fVar8 - fStack_530;
        (*pafVar5)[3] = fVar12 - fStack_52c;
      }
    }
  }
  return;
}

Assistant:

static void radf3_ps(int ido, int l1, const v4sf * RESTRICT cc, v4sf * RESTRICT ch,
                     const float *wa1, const float *wa2) {
  static const float taur = -0.5f;
  static const float taui = 0.866025403784439f;
  int i, k, ic;
  v4sf ci2, di2, di3, cr2, dr2, dr3, ti2, ti3, tr2, tr3, wr1, wi1, wr2, wi2;
  for (k=0; k<l1; k++) {
    cr2 = VADD(cc[(k + l1)*ido], cc[(k + 2*l1)*ido]);
    ch[3*k*ido] = VADD(cc[k*ido], cr2);
    ch[(3*k+2)*ido] = SVMUL(taui, VSUB(cc[(k + l1*2)*ido], cc[(k + l1)*ido]));
    ch[ido-1 + (3*k + 1)*ido] = VADD(cc[k*ido], SVMUL(taur, cr2));
  }
  if (ido == 1) return;
  for (k=0; k<l1; k++) {
    for (i=2; i<ido; i+=2) {
      ic = ido - i;
      wr1 = LD_PS1(wa1[i - 2]); wi1 = LD_PS1(wa1[i - 1]);
      dr2 = cc[i - 1 + (k + l1)*ido]; di2 = cc[i + (k + l1)*ido];
      VCPLXMULCONJ(dr2, di2, wr1, wi1);

      wr2 = LD_PS1(wa2[i - 2]); wi2 = LD_PS1(wa2[i - 1]);
      dr3 = cc[i - 1 + (k + l1*2)*ido]; di3 = cc[i + (k + l1*2)*ido];
      VCPLXMULCONJ(dr3, di3, wr2, wi2);
        
      cr2 = VADD(dr2, dr3);
      ci2 = VADD(di2, di3);
      ch[i - 1 + 3*k*ido] = VADD(cc[i - 1 + k*ido], cr2);
      ch[i + 3*k*ido] = VADD(cc[i + k*ido], ci2);
      tr2 = VADD(cc[i - 1 + k*ido], SVMUL(taur, cr2));
      ti2 = VADD(cc[i + k*ido], SVMUL(taur, ci2));
      tr3 = SVMUL(taui, VSUB(di2, di3));
      ti3 = SVMUL(taui, VSUB(dr3, dr2));
      ch[i - 1 + (3*k + 2)*ido] = VADD(tr2, tr3);
      ch[ic - 1 + (3*k + 1)*ido] = VSUB(tr2, tr3);
      ch[i + (3*k + 2)*ido] = VADD(ti2, ti3);
      ch[ic + (3*k + 1)*ido] = VSUB(ti3, ti2);
    }
  }
}